

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PipelineClient::writeTarget
          (PipelineClient *this,Builder target)

{
  BuilderArena *pBVar1;
  CapTableBuilder *pCVar2;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *pCVar3;
  long in_RSI;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> MVar4;
  Orphanage orphanage;
  Builder builder;
  OrphanBuilder OStack_a8;
  StructBuilder local_88;
  StructBuilder local_58;
  
  *(undefined2 *)((long)target._builder.data + 4) = 1;
  local_88.segment = target._builder.segment;
  local_88.capTable = target._builder.capTable;
  local_88.data = target._builder.pointers;
  PointerBuilder::initStruct(&local_58,(PointerBuilder *)&local_88,(StructSize)0x10001);
  *(undefined4 *)local_58.data = *(undefined4 *)(*(long *)(in_RSI + 0x48) + 0x20);
  local_88.dataSize = local_58.dataSize;
  local_88.pointerCount = local_58.pointerCount;
  local_88._38_2_ = local_58._38_2_;
  local_88.data = local_58.data;
  local_88.pointers = local_58.pointers;
  local_88.segment = local_58.segment;
  local_88.capTable = local_58.capTable;
  pBVar1 = StructBuilder::getArena(&local_88);
  pCVar2 = StructBuilder::getCapTable(&local_88);
  orphanage.capTable = pCVar2;
  orphanage.arena = pBVar1;
  anon_unknown_18::fromPipelineOps
            ((Orphan<capnp::List<capnp::rpc::PromisedAnswer::Op,_(capnp::Kind)3>_> *)&OStack_a8,
             orphanage,*(ArrayPtr<const_capnp::PipelineOp> *)(in_RSI + 0x50));
  local_88.segment = local_58.segment;
  local_88.capTable = local_58.capTable;
  local_88.data = local_58.pointers;
  PointerBuilder::adopt((PointerBuilder *)&local_88,&OStack_a8);
  pCVar3 = extraout_RDX;
  if (OStack_a8.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&OStack_a8);
    pCVar3 = extraout_RDX_00;
  }
  (this->super_RpcClient).super_ClientHook._vptr_ClientHook = (_func_int **)0x0;
  (this->super_RpcClient).super_ClientHook.brand = (void *)0x0;
  MVar4.ptr.ptr = pCVar3;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>)MVar4.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> writeTarget(
        rpc::MessageTarget::Builder target) override {
      auto builder = target.initPromisedAnswer();
      builder.setQuestionId(questionRef->getId());
      builder.adoptTransform(fromPipelineOps(Orphanage::getForMessageContaining(builder), ops));
      return kj::none;
    }